

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

void __thiscall Ruleset::Ruleset(Ruleset *this)

{
  _Rb_tree_header *p_Var1;
  WithDiamondsAsTrump *pWVar2;
  WithSpadesAsTrump *this_00;
  WithCloverAsTrump *this_01;
  WithHeartAsTrump *this_02;
  WithJacksAsTrump *this_03;
  WithQueensAsTrump *this_04;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_50;
  pair<const_char_*,_WithDiamondsAsTrump_*> local_28;
  
  (this->m_nameToRule).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_nameToRule).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nameToRule).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar2 = (WithDiamondsAsTrump *)operator_new(0x20);
  WithDiamondsAsTrump::WithDiamondsAsTrump(pWVar2);
  local_28.first = "WithDiamondsAsTrump";
  local_28.second = pWVar2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithDiamondsAsTrump_*,_true>(&local_50,&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pWVar2 = (WithDiamondsAsTrump *)operator_new(0x20);
  (pWVar2->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pWVar2->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((DifferentTrumpRule *)&(pWVar2->super_DifferentTrumpRule).super_Rule)->super_Rule)._vptr_Rule =
       (_func_int **)0x0;
  (pWVar2->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  WithoutTrump::WithoutTrump((WithoutTrump *)pWVar2);
  local_28.first = "WithoutTrump";
  local_28.second = pWVar2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithoutTrump_*,_true>
            (&local_50,(pair<const_char_*,_WithoutTrump_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = (WithSpadesAsTrump *)operator_new(0x20);
  WithSpadesAsTrump::WithSpadesAsTrump(this_00);
  local_28.first = "WithSpadesAsTrump";
  local_28.second = (WithDiamondsAsTrump *)this_00;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithSpadesAsTrump_*,_true>
            (&local_50,(pair<const_char_*,_WithSpadesAsTrump_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_01 = (WithCloverAsTrump *)operator_new(0x20);
  WithCloverAsTrump::WithCloverAsTrump(this_01);
  local_28.first = "WithCloverAsTrump";
  local_28.second = (WithDiamondsAsTrump *)this_01;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithCloverAsTrump_*,_true>
            (&local_50,(pair<const_char_*,_WithCloverAsTrump_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_02 = (WithHeartAsTrump *)operator_new(0x20);
  WithHeartAsTrump::WithHeartAsTrump(this_02);
  local_28.first = "WithHeartAsTrump";
  local_28.second = (WithDiamondsAsTrump *)this_02;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithHeartAsTrump_*,_true>
            (&local_50,(pair<const_char_*,_WithHeartAsTrump_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_03 = (WithJacksAsTrump *)operator_new(0x20);
  WithJacksAsTrump::WithJacksAsTrump(this_03);
  local_28.first = "WithJacksAsTrump";
  local_28.second = (WithDiamondsAsTrump *)this_03;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithJacksAsTrump_*,_true>
            (&local_50,(pair<const_char_*,_WithJacksAsTrump_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_04 = (WithQueensAsTrump *)operator_new(0x20);
  WithQueensAsTrump::WithQueensAsTrump(this_04);
  local_28.first = "WithQueensAsTrump";
  local_28.second = (WithDiamondsAsTrump *)this_04;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_WithQueensAsTrump_*,_true>
            (&local_50,(pair<const_char_*,_WithQueensAsTrump_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_28.second = (WithDiamondsAsTrump *)operator_new(8);
  ((local_28.second)->super_DifferentTrumpRule).super_Rule._vptr_Rule =
       (_func_int **)&PTR_isTrump_0010ed08;
  local_28.first = "SecondH10BeatsFirstH10";
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_SecondH10BeatsFirst_*,_true>
            (&local_50,(pair<const_char_*,_SecondH10BeatsFirst_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_28.second = (WithDiamondsAsTrump *)operator_new(8);
  ((local_28.second)->super_DifferentTrumpRule).super_Rule._vptr_Rule =
       (_func_int **)&PTR_isTrump_0010ed40;
  local_28.first = "TwoDiamondAAreHigh";
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  ::pair<const_char_*,_TwoDiamondAAreHigh_*,_true>
            (&local_50,(pair<const_char_*,_TwoDiamondAAreHigh_*> *)&local_28);
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Ruleset::Ruleset(){
    m_nameToRule.push_back(std::make_pair("WithDiamondsAsTrump", new WithDiamondsAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithoutTrump" ,  new WithoutTrump()));
    m_nameToRule.push_back(std::make_pair("WithSpadesAsTrump",new  WithSpadesAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithCloverAsTrump",new WithCloverAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithHeartAsTrump",new WithHeartAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithJacksAsTrump",new WithJacksAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithQueensAsTrump",new WithQueensAsTrump()));
    m_nameToRule.push_back(std::make_pair("SecondH10BeatsFirstH10",new SecondH10BeatsFirst()));
    m_nameToRule.push_back(std::make_pair("TwoDiamondAAreHigh",new TwoDiamondAAreHigh()));
}